

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_info_subject_alt_name(char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name)

{
  ulong local_58;
  size_t sep_len;
  char *sep;
  mbedtls_x509_sequence *cur;
  char *p;
  size_t n;
  size_t i;
  mbedtls_x509_sequence *subject_alt_name_local;
  size_t *size_local;
  char **buf_local;
  
  p = (char *)*size;
  cur = (mbedtls_x509_sequence *)*buf;
  sep_len = (long)anon_var_dwarf_16d4a9 + 9;
  local_58 = 0;
  sep = (char *)subject_alt_name;
  while( true ) {
    if (sep == (char *)0x0) {
      *(undefined1 *)&(cur->buf).tag = 0;
      *size = (size_t)p;
      *buf = (char *)cur;
      return 0;
    }
    if (p <= (char *)(*(long *)(sep + 8) + local_58)) break;
    p = p + -(*(long *)(sep + 8) + local_58);
    for (n = 0; n < local_58; n = n + 1) {
      *(undefined1 *)&(cur->buf).tag = *(undefined1 *)(sep_len + n);
      cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + 1);
    }
    for (n = 0; n < *(ulong *)(sep + 8); n = n + 1) {
      *(undefined1 *)&(cur->buf).tag = *(undefined1 *)(*(long *)(sep + 0x10) + n);
      cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + 1);
    }
    sep_len = (size_t)anon_var_dwarf_13dae7;
    local_58 = 2;
    sep = *(char **)(sep + 0x18);
  }
  *(undefined1 *)&(cur->buf).tag = 0;
  return -0x2980;
}

Assistant:

static int x509_info_subject_alt_name( char **buf, size_t *size,
                                       const mbedtls_x509_sequence *subject_alt_name )
{
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    const char *sep = "";
    size_t sep_len = 0;

    while( cur != NULL )
    {
        if( cur->buf.len + sep_len >= n )
        {
            *p = '\0';
            return( MBEDTLS_ERR_X509_BUFFER_TOO_SMALL );
        }

        n -= cur->buf.len + sep_len;
        for( i = 0; i < sep_len; i++ )
            *p++ = sep[i];
        for( i = 0; i < cur->buf.len; i++ )
            *p++ = cur->buf.p[i];

        sep = ", ";
        sep_len = 2;

        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return( 0 );
}